

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge.cc
# Opt level: O3

range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
 __thiscall
tchecker::system::loc_edges_maps_t::edges(loc_edges_maps_t *this,loc_id_t loc,event_id_t event)

{
  pointer pvVar1;
  long lVar2;
  range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
  *prVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar4 = (ulong)loc;
  pvVar1 = (this->_loc_event_to_edges).
           super__Vector_base<std::vector<std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>_>_>,_std::allocator<std::vector<std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = ((long)(this->_loc_event_to_edges).
                 super__Vector_base<std::vector<std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>_>_>,_std::allocator<std::vector<std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
          -0x5555555555555555;
  prVar3 = (range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
            *)&_empty_edges;
  if (uVar4 <= uVar5 && uVar5 - uVar4 != 0) {
    uVar5 = (ulong)event;
    lVar2 = *(long *)&pvVar1[uVar4].
                      super__Vector_base<std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>_>_>
                      ._M_impl.super__Vector_impl_data;
    uVar4 = ((long)*(pointer *)
                    ((long)&pvVar1[uVar4].
                            super__Vector_base<std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>_>_>
                            ._M_impl.super__Vector_impl_data + 8) - lVar2 >> 3) *
            -0x5555555555555555;
    if (uVar5 <= uVar4 && uVar4 - uVar5 != 0) {
      prVar3 = (range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
                *)(lVar2 + uVar5 * 0x18);
    }
  }
  return *prVar3;
}

Assistant:

tchecker::range_t<tchecker::system::edges_collection_const_iterator_t> loc_edges_maps_t::edges(tchecker::loc_id_t loc,
                                                                                               tchecker::event_id_t event) const
{
  if (loc >= _loc_event_to_edges.size() || event >= _loc_event_to_edges[loc].size())
    return tchecker::make_range<tchecker::system::edges_collection_const_iterator_t>(_empty_edges.begin(), _empty_edges.end());
  return tchecker::make_range<tchecker::system::edges_collection_const_iterator_t>(_loc_event_to_edges[loc][event].begin(),
                                                                                   _loc_event_to_edges[loc][event].end());
}